

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O3

btree_result btree_remove(btree *btree,void *key)

{
  ushort uVar1;
  uint16_t uVar2;
  _func_voidref_void_ptr_bid_t *p_Var3;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var4;
  _func_bid_t_void_ptr *p_Var5;
  code *pcVar6;
  _func_voidref_bid_t_ptr *p_Var7;
  _func_void_void_ptr_bid_t *p_Var8;
  _func_size_t_void_ptr_bid_t *p_Var9;
  _func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t *p_Var10;
  _func_voidref_void_ptr_bid_t_ptr *p_Var11;
  _func_void_bnode_ptr_bnode_ptr_idx_t_idx_t_idx_t *p_Var12;
  _func_int_void_ptr_bid_t *p_Var13;
  _func_voidref_void_ptr_bid_t_bid_t_ptr *p_Var14;
  _func_void_void_ptr *p_Var15;
  bnode *pbVar16;
  undefined1 *puVar17;
  ushort uVar18;
  idx_t iVar19;
  metasize_t mVar20;
  int iVar21;
  bnode *node_2;
  ulong uVar22;
  bnode *pbVar23;
  bid_t bVar24;
  voidref pvVar25;
  size_t sVar26;
  size_t sVar27;
  bnode *pbVar28;
  btree_print_func *pbVar29;
  ulong uVar30;
  undefined1 *puVar31;
  ushort *puVar32;
  undefined1 *puVar33;
  uint uVar34;
  btree_result bVar35;
  ulong uVar36;
  bnode *node;
  undefined1 *puVar37;
  void *pvVar38;
  void *pvVar39;
  long lVar40;
  bool bVar41;
  undefined8 uStack_d0;
  undefined1 auStack_c8 [8];
  ulong local_c0;
  bid_t _bid;
  bid_t new_root_bid;
  ulong local_a8;
  void *local_a0;
  undefined1 *local_98;
  long local_90;
  void *local_88;
  long local_80;
  undefined1 *local_78;
  bnode *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  void *local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 *local_38;
  
  uVar22 = (ulong)(btree->ksize + 0xf & 0xfffffff0);
  local_38 = auStack_c8 + -uVar22;
  uVar36 = (ulong)(btree->vsize + 0xf & 0xfffffff0);
  puVar37 = local_38 + -uVar36;
  local_58 = puVar37 + -uVar22;
  local_78 = local_58 + -uVar36;
  uVar18 = btree->height;
  uVar22 = (ulong)uVar18;
  local_90 = (long)local_78 - (ulong)((uint)uVar18 * 2 + 0xf & 0xfffffff0);
  uVar36 = (ulong)((uint)uVar18 * 8 + 0xf & 0xfffffff0);
  local_40 = local_90 - uVar36;
  uVar30 = (ulong)(uVar18 + 0xf & 0xfffffff0);
  pvVar38 = (void *)(local_40 - uVar30);
  pvVar39 = (void *)((long)pvVar38 - uVar30);
  puVar33 = (undefined1 *)((long)pvVar39 - uVar30);
  puVar31 = puVar33 + -uVar36;
  local_88 = key;
  local_68 = puVar31;
  local_60 = puVar33;
  if (uVar18 != 0) {
    *(undefined8 *)(puVar31 + -8) = 0x10b27d;
    memset(puVar33,0,uVar22);
    *(undefined8 *)(puVar31 + -8) = 0x10b28a;
    memset(pvVar38,0,uVar22);
    *(undefined8 *)(puVar31 + -8) = 0x10b297;
    memset(pvVar39,0,uVar22);
  }
  puVar33 = local_38;
  pbVar29 = btree->kv_ops->init_kv_var;
  local_a0 = pvVar39;
  if (pbVar29 != (btree_print_func *)0x0) {
    *(undefined8 *)(puVar31 + -8) = 0x10b2bb;
    (*pbVar29)(btree,puVar33,puVar37);
    puVar17 = local_58;
    puVar33 = local_78;
    pbVar29 = btree->kv_ops->init_kv_var;
    *(undefined8 *)(puVar31 + -8) = 0x10b2cd;
    (*pbVar29)(btree,puVar17,puVar33);
    uVar18 = btree->height;
    uVar22 = (ulong)uVar18;
  }
  *local_60 = 1;
  *(bid_t *)(local_40 + -8 + uVar22 * 8) = btree->root_bid;
  lVar40 = local_40;
  puVar33 = puVar37;
  if (uVar18 != 0) {
    do {
      local_48 = puVar33;
      local_50 = pvVar38;
      pvVar38 = btree->blk_handle;
      bVar24 = *(bid_t *)(lVar40 + -8 + uVar22 * 8);
      p_Var3 = btree->blk_ops->blk_read;
      *(undefined8 *)(puVar31 + -8) = 0x10b313;
      pbVar23 = (bnode *)(*p_Var3)(pvVar38,bVar24);
      pvVar38 = local_88;
      pbVar28 = pbVar23 + 1;
      if ((pbVar23->flag & 2) != 0) {
        pbVar28 = (bnode *)((long)&pbVar28->kvsize +
                           (ulong)((ushort)(pbVar28->kvsize << 8 | pbVar28->kvsize >> 8) + 0x11 &
                                  0xfffffff0));
      }
      (pbVar23->field_4).data = pbVar28;
      *(bnode **)(local_68 + uVar22 * 8 + -8) = pbVar23;
      *(undefined8 *)(puVar31 + -8) = 0x10b350;
      iVar19 = _btree_find_entry(btree,pbVar23,pvVar38);
      puVar33 = local_38;
      puVar37 = local_48;
      *(idx_t *)(local_90 + -2 + uVar22 * 2) = iVar19;
      if (iVar19 == 0xffff) {
        p_Var15 = btree->blk_ops->blk_operation_end;
        if (p_Var15 != (_func_void_void_ptr *)0x0) {
          pvVar38 = btree->blk_handle;
          *(undefined8 *)(puVar31 + -8) = 0x10b89f;
          (*p_Var15)(pvVar38);
        }
        pbVar29 = btree->kv_ops->free_kv_var;
        bVar35 = BTREE_RESULT_FAIL;
        puVar37 = local_48;
        if (pbVar29 == (btree_print_func *)0x0) {
          return BTREE_RESULT_FAIL;
        }
        goto LAB_0010b85c;
      }
      p_Var4 = btree->kv_ops->get_kv;
      *(undefined8 *)(puVar31 + -8) = 0x10b37f;
      (*p_Var4)(pbVar23,iVar19,puVar33,puVar37);
      lVar40 = local_40;
      if (uVar22 == 1) break;
      uVar36 = uVar22 - 1;
      p_Var5 = btree->kv_ops->value2bid;
      *(undefined8 *)(puVar31 + -8) = 0x10b398;
      bVar24 = (*p_Var5)(puVar37);
      *(bid_t *)(lVar40 + -0x10 + uVar22 * 8) =
           bVar24 >> 0x38 | (bVar24 & 0xff000000000000) >> 0x28 | (bVar24 & 0xff0000000000) >> 0x18
           | (bVar24 & 0xff00000000) >> 8 | (bVar24 & 0xff000000) << 8 | (bVar24 & 0xff0000) << 0x18
           | (bVar24 & 0xff00) << 0x28 | bVar24 << 0x38;
      uVar22 = uVar36;
      pvVar38 = local_50;
      puVar33 = local_48;
    } while (uVar36 != 0);
    if (btree->height != 0) {
      pvVar38 = (void *)0x0;
      local_80 = 0;
      uVar22 = 1;
      do {
        puVar17 = local_38;
        puVar33 = local_48;
        puVar37 = local_68;
        local_88 = pvVar38;
        if (uVar22 != 1) {
          pbVar23 = *(bnode **)(local_68 + uVar22 * 8 + -8);
          iVar19 = *(idx_t *)(local_90 + -2 + uVar22 * 2);
          p_Var4 = btree->kv_ops->get_kv;
          *(undefined8 *)(puVar31 + -8) = 0x10b400;
          (*p_Var4)(pbVar23,iVar19,puVar17,puVar33);
          puVar17 = local_58;
          puVar33 = local_78;
          pbVar28 = *(bnode **)(puVar37 + uVar22 * 8 + -0x10);
          if (pbVar28->nentry != 0) {
            p_Var4 = btree->kv_ops->get_kv;
            *(undefined8 *)(puVar31 + -8) = 0x10b41f;
            (*p_Var4)(pbVar28,0,puVar17,puVar33);
            puVar37 = local_38;
            pvVar38 = btree->aux;
            pcVar6 = (code *)btree->kv_ops->cmp;
            *(undefined8 *)(puVar31 + -8) = 0x10b431;
            iVar21 = (*pcVar6)(puVar17,puVar37,pvVar38);
            puVar33 = local_48;
            puVar37 = local_58;
            if (iVar21 != 0) {
              p_Var4 = btree->kv_ops->set_kv;
              *(undefined8 *)(puVar31 + -8) = 0x10b44d;
              (*p_Var4)(pbVar23,iVar19,puVar37,puVar33);
              puVar33 = local_38;
              pbVar29 = btree->kv_ops->set_key;
              *(undefined8 *)(puVar31 + -8) = 0x10b45e;
              (*pbVar29)(btree,puVar33,puVar37);
              *(undefined1 *)((long)local_50 + (uVar22 - 1)) = 1;
            }
          }
          if (*(char *)((long)local_a0 + (uVar22 - 2)) != '\0') {
            uVar36 = *(ulong *)(local_40 + -0x10 + uVar22 * 8);
            local_c0 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                       (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                       (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                       (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38;
            p_Var4 = btree->kv_ops->set_kv;
            p_Var7 = btree->kv_ops->bid2value;
            *(undefined8 *)(puVar31 + -8) = 0x10b49c;
            pvVar25 = (*p_Var7)(&local_c0);
            puVar37 = local_38;
            *(undefined8 *)(puVar31 + -8) = 0x10b4ac;
            (*p_Var4)(pbVar23,iVar19,puVar37,pvVar25);
            *(undefined1 *)((long)local_50 + (uVar22 - 1)) = 1;
          }
        }
        puVar33 = local_38;
        puVar37 = local_48;
        if (local_60[uVar22 - 1] != '\0') {
          pbVar23 = *(bnode **)(local_68 + uVar22 * 8 + -8);
          iVar19 = *(idx_t *)(local_90 + -2 + uVar22 * 2);
          p_Var4 = btree->kv_ops->get_kv;
          *(undefined8 *)(puVar31 + -8) = 0x10b4f0;
          (*p_Var4)(pbVar23,iVar19,puVar33,puVar37);
          puVar33 = local_38;
          if (pbVar23->nentry == 0) {
            puVar33 = (undefined1 *)((long)local_50 + local_80);
            *(undefined1 *)((long)local_50 + (uVar22 - 1)) = 1;
LAB_0010b569:
            uVar18 = btree->height;
            uVar36 = (ulong)uVar18;
            if (uVar36 <= uVar22) {
              uVar30 = local_80 + 1;
              goto LAB_0010b588;
            }
          }
          else {
            *(undefined8 *)(puVar31 + -8) = 0x10b508;
            iVar19 = _btree_find_entry(btree,pbVar23,puVar33);
            if (iVar19 == 0xffff) {
              iVar19 = pbVar23->nentry;
            }
            else {
              p_Var4 = btree->kv_ops->ins_kv;
              *(undefined8 *)(puVar31 + -8) = 0x10b520;
              (*p_Var4)(pbVar23,iVar19,(void *)0x0,(void *)0x0);
              iVar19 = pbVar23->nentry - 1;
              pbVar23->nentry = iVar19;
            }
            puVar33 = (undefined1 *)((long)local_50 + (uVar22 - 1));
            *puVar33 = 1;
            if (iVar19 != 1) {
              if (iVar19 != 0) goto LAB_0010b78f;
              goto LAB_0010b569;
            }
            uVar18 = btree->height;
            uVar36 = (ulong)uVar18;
            uVar30 = uVar22;
LAB_0010b588:
            if (uVar30 != uVar36) goto LAB_0010b78f;
          }
          if (1 < uVar18) {
            pvVar38 = btree->blk_handle;
            bVar24 = *(bid_t *)(local_40 + -8 + uVar22 * 8);
            p_Var8 = btree->blk_ops->blk_remove;
            new_root_bid = (bid_t)puVar33;
            *(undefined8 *)(puVar31 + -8) = 0x10b5b6;
            (*p_Var8)(pvVar38,bVar24);
            puVar33 = local_38;
            if (uVar22 < btree->height) {
              local_60[uVar22] = 1;
            }
            else {
              puVar31 = puVar31 + -((ulong)btree->blksize + 0xf & 0xfffffffffffffff0);
              p_Var4 = btree->kv_ops->get_kv;
              local_98 = puVar31;
              *(undefined8 *)(puVar31 + -8) = 0x10b5fa;
              (*p_Var4)(pbVar23,0,puVar33,puVar37);
              p_Var5 = btree->kv_ops->value2bid;
              *(undefined8 *)(puVar31 + -8) = 0x10b604;
              bVar24 = (*p_Var5)(puVar37);
              uVar36 = bVar24 >> 0x38 | (bVar24 & 0xff000000000000) >> 0x28 |
                       (bVar24 & 0xff0000000000) >> 0x18 | (bVar24 & 0xff00000000) >> 8 |
                       (bVar24 & 0xff000000) << 8 | (bVar24 & 0xff0000) << 0x18 |
                       (bVar24 & 0xff00) << 0x28 | bVar24 << 0x38;
              pvVar38 = btree->blk_handle;
              p_Var3 = btree->blk_ops->blk_read;
              *(undefined8 *)(puVar31 + -8) = 0x10b618;
              local_70 = (bnode *)(*p_Var3)(pvVar38,uVar36);
              pbVar23 = local_70 + 1;
              if ((local_70->flag & 2) != 0) {
                pbVar23 = (bnode *)((long)&pbVar23->kvsize +
                                   (ulong)((ushort)(pbVar23->kvsize << 8 | pbVar23->kvsize >> 8) +
                                           0x11 & 0xfffffff0));
              }
              (local_70->field_4).data = pbVar23;
              pvVar38 = btree->blk_handle;
              p_Var9 = btree->blk_ops->blk_get_size;
              local_a8 = uVar36;
              *(undefined8 *)(puVar31 + -8) = 0x10b656;
              sVar26 = (*p_Var9)(pvVar38,uVar36);
              puVar37 = local_98;
              *(undefined8 *)(puVar31 + -8) = 0x10b66b;
              mVar20 = btree_read_meta(btree,puVar37);
              pbVar23 = local_70;
              uVar34 = mVar20 + 0x11 & 0xfffffff0;
              uVar36 = (ulong)uVar34;
              p_Var10 = btree->kv_ops->get_data_size;
              *(undefined8 *)(puVar31 + -8) = 0x10b68b;
              sVar27 = (*p_Var10)(pbVar23,(void *)0x0,(void *)0x0,(void *)0x0,0);
              if (mVar20 == 0) {
                uVar34 = 0;
              }
              puVar37 = local_48;
              if ((int)sVar27 + uVar34 + 0x10 < (int)sVar26 - 1U) {
                btree->height = btree->height - 1;
                pvVar38 = btree->blk_handle;
                p_Var11 = btree->blk_ops->blk_alloc;
                *(undefined8 *)(puVar31 + -8) = 0x10b6bd;
                pbVar23 = (bnode *)(*p_Var11)(pvVar38,&_bid);
                puVar37 = local_98;
                uVar18 = btree->root_flag;
                uVar1._0_1_ = btree->ksize;
                uVar1._1_1_ = btree->vsize;
                uVar2 = btree->height;
                pbVar23->kvsize = uVar1 << 8 | uVar1 >> 8;
                pbVar23->nentry = 0;
                pbVar23->level = uVar2;
                pbVar23->flag = uVar18;
                if ((uVar18 & 2) == 0) {
                  pbVar28 = pbVar23 + 1;
                  (pbVar23->field_4).data = pbVar28;
                }
                else {
                  pbVar23[1].kvsize = mVar20 << 8 | mVar20 >> 8;
                  *(undefined8 *)(puVar31 + -8) = 0x10b715;
                  memcpy(&pbVar23[1].flag,puVar37,(ulong)mVar20);
                  (pbVar23->field_4).data = (void *)((long)&pbVar23[1].kvsize + uVar36);
                  pbVar28 = (bnode *)((long)&pbVar23[1].kvsize +
                                     (ulong)((ushort)(pbVar23[1].kvsize << 8 |
                                                     pbVar23[1].kvsize >> 8) + 0x11 & 0xfffffff0));
                }
                pbVar16 = local_70;
                (pbVar23->field_4).data = pbVar28;
                iVar19 = local_70->nentry;
                p_Var12 = btree->kv_ops->copy_kv;
                *(undefined8 *)(puVar31 + -8) = 0x10b759;
                (*p_Var12)(pbVar23,pbVar16,0,0,iVar19);
                uVar36 = local_a8;
                pbVar23->nentry = pbVar16->nentry;
                pvVar38 = btree->blk_handle;
                p_Var8 = btree->blk_ops->blk_remove;
                *(undefined8 *)(puVar31 + -8) = 0x10b776;
                (*p_Var8)(pvVar38,uVar36);
                btree->root_bid = _bid;
                *(undefined1 *)new_root_bid = 0;
                puVar37 = local_48;
              }
            }
          }
        }
LAB_0010b78f:
        lVar40 = local_40;
        pvVar38 = local_88;
        if (*(char *)((long)local_50 + (uVar22 - 1)) != '\0') {
          pvVar39 = btree->blk_handle;
          bVar24 = *(bid_t *)(local_40 + -8 + uVar22 * 8);
          p_Var13 = btree->blk_ops->blk_is_writable;
          *(undefined8 *)(puVar31 + -8) = 0x10b7b3;
          iVar21 = (*p_Var13)(pvVar39,bVar24);
          pvVar39 = btree->blk_handle;
          bVar24 = *(bid_t *)(lVar40 + -8 + uVar22 * 8);
          if (iVar21 == 0) {
            p_Var14 = btree->blk_ops->blk_move;
            *(undefined8 *)(puVar31 + -8) = 0x10b7d0;
            pvVar25 = (*p_Var14)(pvVar39,bVar24,(bid_t *)(lVar40 + (long)pvVar38));
            puVar32 = (ushort *)((long)pvVar25 + 0x10);
            if ((*(byte *)((long)pvVar25 + 2) & 2) != 0) {
              puVar32 = (ushort *)
                        ((long)puVar32 +
                        (ulong)((ushort)(*puVar32 << 8 | *puVar32 >> 8) + 0x11 & 0xfffffff0));
            }
            *(ushort **)((long)pvVar25 + 8) = puVar32;
            *(voidref *)(local_68 + uVar22 * 8 + -8) = pvVar25;
            *(undefined1 *)((long)local_a0 + (uVar22 - 1)) = 1;
            if (uVar22 == btree->height) {
              btree->root_bid = *(bid_t *)(local_40 + -8 + uVar22 * 8);
            }
          }
          else {
            p_Var8 = btree->blk_ops->blk_set_dirty;
            *(undefined8 *)(puVar31 + -8) = 0x10b7c7;
            (*p_Var8)(pvVar39,bVar24);
          }
        }
        local_80 = local_80 + 1;
        pvVar38 = (void *)((long)pvVar38 + 8);
        bVar41 = uVar22 < btree->height;
        uVar22 = uVar22 + 1;
      } while (bVar41);
    }
  }
  p_Var15 = btree->blk_ops->blk_operation_end;
  if (p_Var15 != (_func_void_void_ptr *)0x0) {
    pvVar38 = btree->blk_handle;
    *(undefined8 *)(puVar31 + -8) = 0x10b84c;
    (*p_Var15)(pvVar38);
  }
  pbVar29 = btree->kv_ops->free_kv_var;
  bVar35 = BTREE_RESULT_SUCCESS;
  if (pbVar29 != (btree_print_func *)0x0) {
LAB_0010b85c:
    puVar33 = local_38;
    *(undefined8 *)(puVar31 + -8) = 0x10b868;
    (*pbVar29)(btree,puVar33,puVar37);
    puVar33 = local_58;
    puVar37 = local_78;
    pbVar29 = btree->kv_ops->free_kv_var;
    *(undefined8 *)(puVar31 + -8) = 0x10b87a;
    (*pbVar29)(btree,puVar33,puVar37);
  }
  return bVar35;
}

Assistant:

btree_result btree_remove(struct btree *btree, void *key)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v= alca(uint8_t, btree->vsize);
    uint8_t *kk = alca(uint8_t, btree->ksize);
    uint8_t *vv = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid= alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *rmv = alca(int8_t, btree->height);
    // index# of removed key
    idx_t *idx_rmv = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = rmv[i] = 0;
    }
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        btree->kv_ops->init_kv_var(btree, kk, vv);
    }

    rmv[0] = 1;

    // set root
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, k, v);
                btree->kv_ops->free_kv_var(btree, kk, vv);
            }
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
        }
    }

    // cascaded remove from leaf to root
    for (i=0;i<btree->height;++i){
        // in case of index node
        if (i > 0) {
            btree->kv_ops->get_kv(node[i], idx[i], k, v);

            // when child node's smallest key is changed due to remove
              if (node[i-1]->nentry > 0) {
                btree->kv_ops->get_kv(node[i-1], 0, kk, vv);
                if (btree->kv_ops->cmp(kk, k, btree->aux)) {
                    // change current node's corresponding key
                    btree->kv_ops->set_kv(node[i], idx[i], kk, v);
                    //memcpy(k, kk, btree->ksize);
                    btree->kv_ops->set_key(btree, k, kk);
                    modified[i] = 1;
                }
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (rmv[i]) {
            // there is a key-value pair to be removed
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            idx_rmv[i] = _btree_remove_entry(btree, node[i], k);
            modified[i] = 1;

            /*
            remove the node when
            1. non-root node has no kv-pair or
            2. root node has less or equal than one kv-pair
            */
            if (((node[i]->nentry < 1 && i+1 < btree->height) ||
                (node[i]->nentry <= 1 && i+1 == btree->height)) &&
                btree->height > 1) {
                // remove the node
                btree->blk_ops->blk_remove(btree->blk_handle, bid[i]);
                if (i+1 < btree->height) {
                    // if non-root node
                    rmv[i+1] = 1;
                } else {
                    // if root node, shrink the height

                    // allocate new block for new root node
                    uint8_t *buf = alca(uint8_t, btree->blksize);
                    uint32_t nodesize = 0, new_rootsize = 0;
                    bid_t child_bid, new_root_bid;
                    struct bnode *new_root, *child;
                    struct btree_meta meta;

                    // read the child node
                    btree->kv_ops->get_kv(node[i], 0, k, v);
                    child_bid = btree->kv_ops->value2bid(v);
                    child_bid = _endian_decode(child_bid);
                    addr = btree->blk_ops->blk_read(btree->blk_handle, child_bid);
                    child = _fetch_bnode(btree, addr, btree->height);

                    nodesize = btree->blk_ops->blk_get_size(btree->blk_handle, child_bid);
#ifdef __CRC32
                    nodesize -= BLK_MARKER_SIZE;
#endif

                    // estimate the new root node size including metadata
                    meta.size = btree_read_meta(btree, buf);
                    meta.data = buf;

                    if (meta.size) {
                        new_rootsize += _metasize_align(meta.size) + sizeof(metasize_t);
                    }
                    new_rootsize += btree->kv_ops->get_data_size(child, NULL, NULL, NULL, 0);
                    new_rootsize += sizeof(struct bnode);

                    if (new_rootsize < nodesize) {
                        // new root node has enough space for metadata .. shrink height
                        btree->height--;

                        // allocate a new node with the given meta
                        addr = btree->blk_ops->blk_alloc(btree->blk_handle,
                                                         &new_root_bid);
                        _btree_init_node(btree, new_root_bid, addr,
                                         btree->root_flag, btree->height, &meta);
                        new_root = _fetch_bnode(btree, addr, btree->height);

                        // copy all entries
                        btree->kv_ops->copy_kv(new_root, child, 0, 0, child->nentry);
                        new_root->nentry = child->nentry;
                        // invalidate chlid node
                        btree->blk_ops->blk_remove(btree->blk_handle, child_bid);

                        btree->root_bid = new_root_bid;

                        // as the old node is invalidated,
                        // we don't need to move it.
                        modified[i] = 0;
                    }
                }
            }
        }

        if (modified[i]) {
            // when node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // already flushed block -> cannot overwrite, so
                // we have to move to new block
                // get new bid[i]
                addr = btree->blk_ops->blk_move(btree->blk_handle, bid[i],
                                                &bid[i]);
                node[i] = _fetch_bnode(btree, addr, i+1);
                moved[i] = 1;

                if (i+1 == btree->height)
                    // if moved node is root node
                    btree->root_bid = bid[i];

            }else{
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            }

        }
    }

    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) {
        btree->kv_ops->free_kv_var(btree, k, v);
        btree->kv_ops->free_kv_var(btree, kk, vv);
    }
    return BTREE_RESULT_SUCCESS;
}